

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool duckdb::SubtractPropagateStatistics::Operation<signed_char,duckdb::TrySubtractOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  Value local_70;
  
  cVar1 = NumericStats::GetMin<signed_char>(lstats);
  cVar2 = NumericStats::GetMax<signed_char>(rstats);
  cVar4 = (char)((short)cVar1 - (short)cVar2);
  bVar5 = true;
  if ((short)cVar4 == (short)((short)cVar1 - (short)cVar2)) {
    cVar1 = NumericStats::GetMax<signed_char>(lstats);
    cVar2 = NumericStats::GetMin<signed_char>(rstats);
    cVar3 = (char)((short)cVar1 - (short)cVar2);
    if ((short)cVar3 == (short)((short)cVar1 - (short)cVar2)) {
      Value::Numeric(&local_70,type,(long)cVar4);
      Value::operator=(new_min,&local_70);
      Value::~Value(&local_70);
      Value::Numeric(&local_70,type,(long)cVar3);
      Value::operator=(new_max,&local_70);
      Value::~Value(&local_70);
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}